

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_mark.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  vector<double,_std::allocator<double>_> *f0_00;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  string *input_stream;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  char *__s;
  double dVar20;
  int tmp;
  double upper_f0;
  double lower_f0;
  double sampling_rate;
  Polarity polarity;
  vector<double,_std::allocator<double>_> waveform;
  PitchExtraction pitch_extraction;
  vector<double,_std::allocator<double>_> pitch_mark;
  double unvoiced_value;
  double voicing_threshold;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> f0;
  ifstream ifs;
  string local_4c8;
  uint local_4a4;
  double local_4a0;
  ulong local_498;
  uint local_48c;
  double local_488;
  double local_480;
  ulong local_478;
  ulong local_470;
  double local_468;
  Polarity local_45c;
  vector<double,_std::allocator<double>_> local_458;
  PitchExtraction local_438;
  vector<double,_std::allocator<double>_> local_428;
  double local_410;
  long local_408;
  double local_400;
  double local_3f8;
  string local_3f0 [3];
  ios_base local_380 [264];
  vector<double,_std::allocator<double>_> local_278;
  ulong local_258;
  ulong local_250;
  double local_248;
  long local_240;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_468 = 16.0;
  local_480 = 60.0;
  local_488 = 240.0;
  local_3f8 = 0.9;
  local_400 = 0.0;
  local_498 = 0;
  iVar10 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"s:L:H:t:o:u:h",(option *)0x0,(int *)0x0);
    if (iVar4 < 0x68) {
      if (iVar4 != -1) {
        if (iVar4 == 0x48) {
          std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3f0);
          bVar1 = sptk::ConvertStringToDouble(&local_238,&local_488);
          bVar2 = local_488 <= 0.0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (!bVar1 || bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,
                       "The argument for the -H option must be a positive number",0x38);
            local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
            sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
            goto LAB_00105484;
          }
        }
        else {
          if (iVar4 != 0x4c) goto switchD_0010513a_caseD_70;
          std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3f0);
          bVar1 = sptk::ConvertStringToDouble(&local_238,&local_480);
          bVar2 = local_480 <= 10.0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (!bVar1 || bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,"The argument for the -L option must be a number ",0x30
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,"greater than 10",0xf);
            local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
            sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
            goto LAB_00105484;
          }
        }
        goto LAB_00105693;
      }
      iVar4 = 2;
      goto LAB_00105695;
    }
    switch(iVar4) {
    case 0x6f:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3f0);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_4c8);
      if (!bVar2) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
LAB_001055b6:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"in the range of ",0x10);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
        std::ostream::operator<<((ostream *)poVar5,5);
        local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
        sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
        goto LAB_0010564d;
      }
      bVar2 = sptk::IsInRange((int)local_4c8._M_dataplus._M_p,0,5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar2) goto LAB_001055b6;
      iVar4 = 4;
      bVar2 = true;
      local_498 = (ulong)local_4c8._M_dataplus._M_p & 0xffffffff;
      break;
    case 0x70:
    case 0x71:
    case 0x72:
      goto switchD_0010513a_caseD_70;
    case 0x73:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3f0);
      bVar2 = sptk::ConvertStringToDouble(&local_238,&local_468);
      if (!bVar2 || local_468 <= 6.0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
      }
      else {
        dVar20 = local_468;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          local_4a0 = local_468;
          operator_delete(local_238._M_dataplus._M_p);
          dVar20 = local_4a0;
        }
        if (dVar20 <= 98.0) {
          iVar4 = 4;
          bVar2 = true;
          break;
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -s option must be a number ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the interval (",0x11);
      poVar5 = std::ostream::_M_insert<double>(6.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::ostream::_M_insert<double>(98.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
      sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
LAB_0010564d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0[0]._M_dataplus._M_p != &local_3f0[0].field_2) {
        operator_delete(local_3f0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar4 = 1;
      bVar2 = false;
      iVar10 = 1;
      break;
    case 0x74:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3f0);
      bVar2 = sptk::ConvertStringToDouble(&local_238,&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar2) goto LAB_00105693;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -t option must be numeric",0x2e);
      local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
      sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
LAB_00105484:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0[0]._M_dataplus._M_p != &local_3f0[0].field_2) {
        operator_delete(local_3f0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      goto LAB_001054ba;
    case 0x75:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3f0);
      bVar2 = sptk::ConvertStringToDouble(&local_238,&local_400);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -u option must be a number",0x2f);
        local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
        sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
        goto LAB_00105484;
      }
      goto LAB_00105693;
    default:
      if (iVar4 == 0x68) {
        anon_unknown.dwarf_2fd9::PrintUsage((ostream *)&std::cout);
        iVar10 = 0;
        iVar4 = 1;
        goto LAB_00105695;
      }
      goto switchD_0010513a_caseD_70;
    }
    if (bVar2) {
LAB_00105693:
      iVar4 = 0;
    }
LAB_00105695:
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return iVar10;
  }
  if (local_468 * 1000.0 * 0.5 <= local_488) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,
               "Upper fundamental frequency must be less than Nyquist frequency",0x3f);
    local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
LAB_0010581b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0[0]._M_dataplus._M_p != &local_3f0[0].field_2) {
      operator_delete(local_3f0[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    return 1;
  }
  if (local_488 <= local_480) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Lower fundamental frequency must be less than upper one",0x37)
    ;
    local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
    goto LAB_0010581b;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
    goto LAB_0010581b;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  local_4a0 = local_468 * 1000.0;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Cannot set translation mode",0x1b);
    local_3f0[0]._M_dataplus._M_p = (pointer)&local_3f0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"pitch_mark","");
    sptk::PrintErrorMessage(local_3f0,(ostringstream *)&local_238);
    goto LAB_0010581b;
  }
  input_stream = &local_238;
  std::ifstream::ifstream(input_stream);
  if ((__s != (char *)0x0) &&
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"Cannot open file ",0x11);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar6);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"pitch_mark","");
    sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
    std::ios_base::~ios_base(local_380);
    iVar4 = 1;
    goto LAB_00105e4b;
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    input_stream = (string *)&std::cin;
  }
  sptk::PitchExtraction::PitchExtraction
            (&local_438,1,local_4a0,local_480,local_488,local_3f8,kReaper);
  if ((local_438.pitch_extraction_ == (PitchExtractionInterface *)0x0) ||
     (iVar4 = (*(local_438.pitch_extraction_)->_vptr_PitchExtractionInterface[2])(),
     (char)iVar4 == '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"Failed to initialize PitchExtraction",0x24);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"pitch_mark","");
    sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
    std::ios_base::~ios_base(local_380);
    iVar4 = 1;
  }
  else {
    local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    while (bVar2 = sptk::ReadStream<double>((double *)local_3f0,(istream *)input_stream), bVar2) {
      if (local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_458,
                   (iterator)
                   local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)local_3f0);
      }
      else {
        *local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_3f0[0]._M_dataplus._M_p;
        local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    if (local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar4 = 0;
    }
    else {
      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      f0_00 = &local_278;
      if ((uint)local_498 == 2) {
        f0_00 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      if ((uint)local_498 < 2) {
        f0_00 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      bVar2 = sptk::PitchExtraction::Run(&local_438,&local_458,f0_00,&local_428,&local_45c);
      if (bVar2) {
        pdVar7 = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((uint)local_498 != 1) {
          for (; pdVar7 != local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
            *pdVar7 = *pdVar7 * local_4a0;
          }
        }
        if (local_45c == kUnknown) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Failed to detect polarity",0x19);
          local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"pitch_mark","");
          sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
          goto LAB_00105dc1;
        }
        local_410 = *(double *)(&DAT_0012a070 + (ulong)(local_45c == kPositive) * 8);
        local_470 = (ulong)((long)local_458.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_458.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3;
        uVar12 = (uint)((ulong)((long)local_428.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_428.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
        if ((uint)local_498 - 3 < 3) {
          local_48c = (uint)((ulong)((long)local_428.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_428.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 0x22) & 1;
          if (-1 < (int)uVar12) {
            uVar17 = (ulong)(uVar12 & 0x7fffffff);
            uVar14 = (ulong)(uVar12 + 1);
            uVar11 = 0;
            local_4a4 = 0;
            pdVar7 = local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            local_478 = uVar17;
            local_258 = uVar14;
            do {
              uVar12 = (uint)local_470;
              if (uVar11 < uVar17) {
                dVar20 = round(local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar11]);
                uVar12 = (uint)dVar20;
              }
              uVar19 = local_4a4;
              if ((int)local_4a4 < (int)uVar12) {
                pdVar7 = (double *)(ulong)local_4a4;
                pdVar8 = local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + (int)local_4a4;
                uVar18 = local_4a4;
                do {
                  if ((*pdVar8 == 0.0) && (uVar19 = uVar18, !NAN(*pdVar8))) break;
                  uVar18 = uVar18 + 1;
                  pdVar8 = pdVar8 + 1;
                  uVar19 = uVar12;
                } while (uVar12 != uVar18);
              }
              local_250 = uVar11;
              if ((int)local_4a4 < (int)uVar19) {
                local_408 = (long)(int)uVar19;
                pdVar7 = (double *)(local_408 * 8);
                lVar9 = (long)(int)local_4a4 * 8;
                local_248 = 0.0;
                do {
                  local_248 = local_248 +
                              *(double *)
                               ((long)local_278.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar9);
                  lVar9 = lVar9 + 8;
                } while ((long)pdVar7 - lVar9 != 0);
                local_248 = 6.283185307179586 / local_248;
                local_240 = -local_408;
                dVar20 = 0.0;
                bVar2 = true;
                lVar9 = (long)(int)local_4a4;
                do {
                  lVar15 = lVar9 + 1;
                  iVar4 = (int)local_498;
                  if (iVar4 == 5) {
                    local_4a0 = dVar20;
                    dVar20 = fmod(dVar20,6.283185307179586);
                    dVar20 = dVar20 / 3.141592653589793 + -1.0;
LAB_00105fcf:
                    bVar1 = sptk::WriteStream<double>(dVar20 * local_410,(ostream *)&std::cout);
                    if (bVar1) {
                      bVar1 = true;
                      dVar20 = local_4a0 +
                               local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar9] * local_248;
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f0,"Failed to write periodic sequence",0x21);
                      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4c8,"pitch_mark","");
                      sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                        operator_delete(local_4c8._M_dataplus._M_p);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
                      std::ios_base::~ios_base(local_380);
                      bVar1 = false;
                      iVar10 = 1;
                      dVar20 = local_4a0;
                    }
                  }
                  else {
                    if (iVar4 == 4) {
                      local_4a0 = dVar20;
                      dVar20 = cos(dVar20);
                      goto LAB_00105fcf;
                    }
                    if (iVar4 == 3) {
                      local_4a0 = dVar20;
                      dVar20 = sin(dVar20);
                      goto LAB_00105fcf;
                    }
                    bVar1 = false;
                    iVar10 = 1;
                  }
                  if (!bVar1) {
                    bVar1 = true;
                    goto LAB_001060df;
                  }
                  bVar2 = lVar15 < local_408;
                  lVar9 = lVar15;
                } while (local_240 + lVar15 != 0);
                bVar1 = false;
LAB_001060df:
                uVar14 = local_258;
                uVar17 = local_478;
                uVar18 = local_4a4;
                if (!bVar2) goto LAB_001060f6;
              }
              else {
LAB_001060f6:
                bVar1 = (int)uVar19 < (int)uVar12;
                uVar18 = uVar12;
                if ((int)uVar19 < (int)uVar12) {
                  uVar19 = uVar19 + 1;
                  do {
                    bVar2 = sptk::WriteStream<double>(local_400,(ostream *)&std::cout);
                    if (!bVar2) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f0,"Failed to write periodic sequence",0x21);
                      uVar17 = local_478;
                      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4c8,"pitch_mark","");
                      sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                        operator_delete(local_4c8._M_dataplus._M_p);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
                      std::ios_base::~ios_base(local_380);
                      iVar10 = 1;
                      uVar18 = local_4a4;
                      break;
                    }
                    bVar1 = (int)uVar19 < (int)uVar12;
                    pdVar7 = (double *)(ulong)(uVar19 + 1);
                    bVar2 = uVar19 != uVar12;
                    uVar17 = local_478;
                    uVar19 = uVar19 + 1;
                  } while (bVar2);
                }
              }
              local_4a4 = uVar18;
              if (bVar1) break;
              uVar11 = local_250 + 1;
              pdVar7 = (double *)CONCAT71((int7)((ulong)pdVar7 >> 8),uVar17 <= local_250);
              local_48c = (uint)pdVar7;
            } while (uVar11 != uVar14);
          }
          iVar4 = iVar10;
          if ((local_48c & 1) != 0) {
LAB_001063b6:
            iVar4 = 0;
          }
        }
        else {
          iVar4 = 1;
          if ((uint)local_498 - 1 < 2) {
            if (((int)uVar12 < 1) ||
               (bVar2 = sptk::WriteStream<double>
                                  (0,uVar12,&local_428,(ostream *)&std::cout,(int *)0x0), bVar2))
            goto LAB_001063b6;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3f0,"Failed to write pitch mark",0x1a);
            local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"pitch_mark","");
            sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
              operator_delete(local_4c8._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
            std::ios_base::~ios_base(local_380);
          }
          else if ((uint)local_498 == 0) {
            if (local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              iVar4 = -1;
            }
            else {
              dVar20 = round(*local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
              iVar4 = (int)dVar20;
            }
            bVar2 = 0 < (int)local_470;
            if (0 < (int)local_470) {
              iVar16 = 0;
              iVar13 = 1;
              do {
                if (iVar16 == iVar4) {
                  bVar1 = sptk::WriteStream<double>(local_410,(ostream *)&std::cout);
                  if (!bVar1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,"Failed to write pitch mark",0x1a);
                    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_4c8,"pitch_mark","");
                    sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
LAB_00106375:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                      operator_delete(local_4c8._M_dataplus._M_p);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
                    std::ios_base::~ios_base(local_380);
                    iVar10 = 1;
                    break;
                  }
                  if (iVar13 < (int)uVar12) {
                    lVar9 = (long)iVar13;
                    iVar13 = iVar13 + 1;
                    dVar20 = round(local_428.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar9]);
                    iVar4 = (int)dVar20;
                  }
                }
                else {
                  bVar1 = sptk::WriteStream<double>(0.0,(ostream *)&std::cout);
                  if (!bVar1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,"Failed to write pitch mark",0x1a);
                    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_4c8,"pitch_mark","");
                    sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
                    goto LAB_00106375;
                  }
                }
                iVar16 = iVar16 + 1;
                bVar2 = iVar16 < (int)local_470;
              } while (iVar16 != (int)local_470);
            }
            iVar4 = iVar10;
            if (!bVar2) goto LAB_001063b6;
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3f0,"Failed to extract pitch mark",0x1c);
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"pitch_mark","");
        sptk::PrintErrorMessage(&local_4c8,(ostringstream *)local_3f0);
LAB_00105dc1:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
        std::ios_base::~ios_base(local_380);
        iVar4 = 1;
      }
      if (local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_428.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_438._vptr_PitchExtraction = (_func_int **)&PTR__PitchExtraction_00135a30;
  if (local_438.pitch_extraction_ != (PitchExtractionInterface *)0x0) {
    (*(local_438.pitch_extraction_)->_vptr_PitchExtractionInterface[1])();
  }
LAB_00105e4b:
  std::ifstream::~ifstream(&local_238);
  return iVar4;
switchD_0010513a_caseD_70:
  anon_unknown.dwarf_2fd9::PrintUsage((ostream *)&std::cerr);
LAB_001054ba:
  iVar4 = 1;
  iVar10 = 1;
  goto LAB_00105695;
}

Assistant:

int main(int argc, char* argv[]) {
  double sampling_rate(kDefaultSamplingRate);
  double lower_f0(kDefaultLowerF0);
  double upper_f0(kDefaultUpperF0);
  double voicing_threshold(kDefaultVoicingThreshold);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "s:L:H:t:o:u:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        const double min(6.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= min || max < sampling_rate) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a number "
                        << "in the interval (" << min << ", " << max << "]";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_f0) ||
            lower_f0 <= 10.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a number "
                        << "greater than 10";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_f0) ||
            upper_f0 <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToDouble(optarg, &voicing_threshold)) {
          std::ostringstream error_message;
          error_message << "The argument for the -t option must be numeric";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (0.5 * sampling_rate_in_hz <= upper_f0) {
    std::ostringstream error_message;
    error_message
        << "Upper fundamental frequency must be less than Nyquist frequency";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (upper_f0 <= lower_f0) {
    std::ostringstream error_message;
    error_message << "Lower fundamental frequency must be less than upper one";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch_mark", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::PitchExtraction pitch_extraction(
      1, sampling_rate_in_hz, lower_f0, upper_f0, voicing_threshold,
      sptk::PitchExtraction::Algorithms::kReaper);
  if (!pitch_extraction.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PitchExtraction";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::vector<double> waveform;
  {
    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      waveform.push_back(tmp);
    }
  }
  if (waveform.empty()) return 0;

  const bool waveform_output(kBinarySequence != output_format &&
                             kPositionInSeconds != output_format &&
                             kPositionInSamples != output_format);
  std::vector<double> f0;
  std::vector<double> pitch_mark;
  sptk::PitchExtractionInterface::Polarity polarity;
  if (!pitch_extraction.Run(waveform, waveform_output ? &f0 : NULL, &pitch_mark,
                            &polarity)) {
    std::ostringstream error_message;
    error_message << "Failed to extract pitch mark";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (kPositionInSeconds != output_format) {
    std::transform(
        pitch_mark.begin(), pitch_mark.end(), pitch_mark.begin(),
        [sampling_rate_in_hz](double x) { return x * sampling_rate_in_hz; });
  }

  if (sptk::PitchExtractionInterface::Polarity::kUnknown == polarity) {
    std::ostringstream error_message;
    error_message << "Failed to detect polarity";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const double binary_polarity(
      sptk::PitchExtractionInterface::Polarity::kPositive == polarity ? 1.0
                                                                      : -1.0);
  const int waveform_length(static_cast<int>(waveform.size()));
  const int num_pitch_marks(static_cast<int>(pitch_mark.size()));

  switch (output_format) {
    case kBinarySequence: {
      int next_pitch_mark(pitch_mark.empty()
                              ? -1
                              : static_cast<int>(std::round(pitch_mark[0])));
      for (int i(0), j(1); i < waveform_length; ++i) {
        if (i == next_pitch_mark) {
          if (!sptk::WriteStream(binary_polarity, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
          if (j < num_pitch_marks) {
            next_pitch_mark = static_cast<int>(std::round(pitch_mark[j++]));
          }
        } else {
          if (!sptk::WriteStream(0.0, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }
      }
      break;
    }
    case kPositionInSeconds:
    case kPositionInSamples: {
      if (0 < num_pitch_marks &&
          !sptk::WriteStream(0, num_pitch_marks, pitch_mark, &std::cout,
                             NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write pitch mark";
        sptk::PrintErrorMessage("pitch_mark", error_message);
        return 1;
      }
      break;
    }
    case kSine:
    case kCosine:
    case kSawtooth: {
      for (int n(0), i(0); n <= num_pitch_marks; ++n) {
        const int next_pitch_mark(
            n < num_pitch_marks ? static_cast<int>(std::round(pitch_mark[n]))
                                : waveform_length);
        // Find the point across voiced region to unvoiced one.
        int j(i);
        for (; j < next_pitch_mark; ++j) {
          if (0.0 == f0[j]) {
            break;
          }
        }

        // Output periodic sequence.
        if (i < j) {
          const double sum_f0(
              std::accumulate(f0.begin() + i, f0.begin() + j, 0.0));
          const double multiplier(sptk::kTwoPi / sum_f0);

          double phase(0.0);
          for (int k(i); k < j; ++k) {
            double value;
            switch (output_format) {
              case kSine: {
                value = std::sin(phase);
                break;
              }
              case kCosine: {
                value = std::cos(phase);
                break;
              }
              case kSawtooth: {
                value = std::fmod(phase, sptk::kTwoPi) / sptk::kPi - 1.0;
                break;
              }
              default: {
                return 1;
              }
            }
            if (!sptk::WriteStream(binary_polarity * value, &std::cout)) {
              std::ostringstream error_message;
              error_message << "Failed to write periodic sequence";
              sptk::PrintErrorMessage("pitch_mark", error_message);
              return 1;
            }
            phase += multiplier * f0[k];
          }
        }

        // Output unvoiced sequence.
        for (int k(j); k < next_pitch_mark; ++k) {
          if (!sptk::WriteStream(unvoiced_value, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write periodic sequence";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }

        i = next_pitch_mark;
      }
      break;
    }
    default: {
      return 1;
    }
  }

  return 0;
}